

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O1

void __thiscall xscript::parser::ast_node::ast_node(ast_node *this,type_t t,ast_node *p)

{
  ast_node *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  tuple<xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
  this_01;
  symbol_table *__tmp;
  __uniq_ptr_impl<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
  local_28;
  
  this->parent = p;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->type = t;
  tokenizer::token::token(&this->token);
  (this->regs).super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->regs).super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  paVar1 = this->parent;
  if (paVar1 == (ast_node *)0x0) {
    __assert_fail("parent != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/ast_node.cpp"
                  ,0x13,"xscript::parser::ast_node::ast_node(type_t, ast_node *)");
  }
  if (t - ROOT < 2) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139b38;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[1]._M_use_count = 0;
    p_Var2[1]._M_weak_count = 0;
    p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[3]._M_use_count = 0;
    p_Var2[3]._M_weak_count = 0;
    p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)(p_Var2 + 4);
    p_Var2[1]._M_use_count = 1;
    p_Var2[1]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    *(undefined4 *)&p_Var2[3]._vptr__Sp_counted_base = 0x3f800000;
    p_Var2[3]._M_use_count = 0;
    p_Var2[3]._M_weak_count = 0;
    p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var2 + 1);
    this_00 = (this->symbols).
              super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (paVar1->symbols).
             super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->symbols).
                super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(paVar1->symbols).
                super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if ((t != FUNCTION_DECLARATION) && (t != ROOT)) {
    paVar1 = this->parent;
    (this->regs).super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (paVar1->regs).
              super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->regs).
                super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(paVar1->regs).
                super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_01.
  super__Tuple_impl<0UL,_xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
  .super__Head_base<0UL,_xscript::parser::register_allocator_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
        )operator_new(0x50);
  register_allocator::register_allocator
            ((register_allocator *)
             this_01.
             super__Tuple_impl<0UL,_xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
             .super__Head_base<0UL,_xscript::parser::register_allocator_*,_false>._M_head_impl);
  local_28._M_t.
  super__Tuple_impl<0UL,_xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
  .super__Head_base<0UL,_xscript::parser::register_allocator_*,_false>._M_head_impl =
       (tuple<xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
        )(tuple<xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
          )this_01.
           super__Tuple_impl<0UL,_xscript::parser::register_allocator_*,_std::default_delete<xscript::parser::register_allocator>_>
           .super__Head_base<0UL,_xscript::parser::register_allocator_*,_false>._M_head_impl;
  std::__shared_ptr<xscript::parser::register_allocator,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<xscript::parser::register_allocator,(__gnu_cxx::_Lock_policy)2> *)
             &this->regs,
             (unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
              *)&local_28);
  std::
  unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
  ::~unique_ptr((unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
                 *)&local_28);
  return;
}

Assistant:

ast_node::ast_node(type_t t, ast_node* p) :
    parent(p),
    type(t)
{
    assert(parent != nullptr);

    if (t == ROOT || t == BLOCK) {
        symbols = std::make_shared<symbol_table>();
    } else {
        symbols = parent->get_symbols();
    }

    if (t == ROOT || t == FUNCTION_DECLARATION) {
        regs = std::make_unique<register_allocator>();
    } else {
        regs = parent->get_regs();
    }

}